

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int writeMPS_dense_cpp(char *filename,int *numRow_p,int *numCol_p,int *objSense_p,
                      double *objOffset_p,double **A_rw_p,double **rhs_p,double **cost_p,
                      double **lb_p,double **ub_p,int **integerColumn_p)

{
  pointer pdVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  vector<int,_std::allocator<int>_> *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  long *in_stack_00000008;
  long *in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000020;
  long *in_stack_00000028;
  int rtCd;
  int c_n;
  int r_n;
  int ix_n;
  vector<int,_std::allocator<int>_> integerColumn;
  vector<double,_std::allocator<double>_> ub;
  vector<double,_std::allocator<double>_> lb;
  vector<double,_std::allocator<double>_> cost;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> A_rw;
  double objOffset;
  int objSense;
  int numCol;
  int numRow;
  vector<double,_std::allocator<double>_> *this;
  size_type in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int local_f0;
  int local_ec;
  int local_e8;
  vector<int,_std::allocator<int>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  pointer in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  pointer in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c7a9c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c7aa9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c7ab6);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c7ac3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c7ad0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c7add);
  uVar9 = *in_RSI;
  uVar8 = *in_RDX;
  uVar7 = *(uint *)&(in_RCX->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  pdVar1 = (in_R8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  printf("writeMPS_dense_cpp: Model has %d rows and %d columns\n",(ulong)uVar9,(ulong)uVar8);
  printf("writeMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n",pdVar1,(ulong)uVar7);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  printf("writeMPS_dense_cpp: Allocated space\n");
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  for (local_e8 = 0; local_e8 < (int)(uVar9 * uVar8); local_e8 = local_e8 + 1) {
    vVar2 = (in_R9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[local_e8];
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffa0,
                        (long)local_e8);
    *pvVar5 = vVar2;
  }
  for (local_ec = 0; local_ec < (int)uVar9; local_ec = local_ec + 1) {
    vVar2 = *(value_type *)(*in_stack_00000008 + (long)local_ec * 8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff88,
                        (long)local_ec);
    *pvVar5 = vVar2;
  }
  for (local_f0 = 0; local_f0 < (int)uVar8; local_f0 = local_f0 + 1) {
    vVar2 = *(value_type *)(*in_stack_00000010 + (long)local_f0 * 8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff70,
                        (long)local_f0);
    *pvVar5 = vVar2;
    vVar2 = *(value_type *)(*in_stack_00000018 + (long)local_f0 * 8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,(long)local_f0);
    *pvVar5 = vVar2;
    vVar2 = *(value_type *)(*in_stack_00000020 + (long)local_f0 * 8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_c0,(long)local_f0);
    *pvVar5 = vVar2;
    vVar3 = *(value_type *)(*in_stack_00000028 + (long)local_f0 * 4);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,(long)local_f0);
    *pvVar6 = vVar3;
  }
  printf("writeMPS_dense_cpp: Copied A, RHS, costs and bounds\n");
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  this = &local_c0;
  iVar4 = writeMPS_dense((char *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98,
                         (int *)in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(uVar7,in_stack_ffffffffffffffc0),
                         (vector<double,_std::allocator<double>_> *)CONCAT44(uVar9,uVar8),in_R9,
                         in_R8,in_RCX);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return iVar4;
}

Assistant:

int writeMPS_dense_cpp(const char *filename, int* numRow_p, int* numCol_p, int* objSense_p, double* objOffset_p,
		     double ** A_rw_p,
		     double ** rhs_p, double ** cost_p, double ** lb_p, double ** ub_p,
		     int** integerColumn_p) {
  int numRow, numCol, objSense;
  double objOffset;
  vector<double> A_rw, rhs, cost, lb, ub;
  vector<int> integerColumn;
  numRow = (*numRow_p);
  numCol = (*numCol_p);
  objSense = (*objSense_p);
  objOffset = (*objOffset_p);
#ifdef JAJH_dev
  printf("writeMPS_dense_cpp: Model has %d rows and %d columns\n", numRow, numCol);
  printf("writeMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
#endif
  A_rw.resize(numRow*numCol);
  rhs.resize(numRow);
  cost.resize(numCol);
  lb.resize(numCol);
  ub.resize(numCol);
  integerColumn.resize(numCol);
  printf("writeMPS_dense_cpp: Allocated space\n");cout<<flush;
  for (int ix_n=0; ix_n<numRow*numCol; ix_n++) {
    A_rw[ix_n] = (*A_rw_p)[ix_n];
  }
  for (int r_n=0; r_n<numRow; r_n++) {
    rhs[r_n] = (*rhs_p)[r_n];
  }
  for (int c_n=0; c_n<numCol; c_n++) {
    cost[c_n] = (*cost_p)[c_n];
    lb[c_n] = (*lb_p)[c_n];
    ub[c_n] = (*ub_p)[c_n];
    integerColumn[c_n] = (*integerColumn_p)[c_n];
  }
  printf("writeMPS_dense_cpp: Copied A, RHS, costs and bounds\n");cout<<flush;
  int rtCd = writeMPS_dense(filename, numRow, numCol, objSense, objOffset,
			    A_rw,
			    rhs, cost, lb, ub,
			    integerColumn);
  return rtCd;
}